

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fiosav(voccxdef *vctx,char *fname,char *game_fname)

{
  ushort uVar1;
  ushort uVar2;
  char *f;
  uint16_t tmp_2;
  FILE *__s;
  size_t sVar3;
  size_t sVar4;
  vocidef ***pppvVar5;
  uchar *__ptr;
  int iVar6;
  uint16_t tmp;
  ulong __size;
  uint16_t tmp_1;
  mcmon objnum;
  ulong uVar7;
  uint16_t tmp_3;
  uint uVar8;
  mcmcxdef *ctx;
  vocidef **ppvVar9;
  long lVar10;
  uchar buf [8];
  fiosav_cb_ctx fnctx;
  undefined1 local_88 [3];
  ushort local_85;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  voccxdef *local_80;
  FILE *local_78;
  int local_6c;
  ulong local_68;
  mcmcxdef *local_60;
  char *local_58;
  vocidef ***local_50;
  vocidef **local_48;
  int local_40 [2];
  FILE *local_38;
  
  ctx = vctx->voccxmem;
  local_80 = vctx;
  __s = fopen(fname,"wb");
  if (__s == (FILE *)0x0) {
    return 1;
  }
  if (game_fname != (char *)0x0) {
    sVar3 = strlen(game_fname);
    local_88._0_2_ = (short)sVar3;
    sVar4 = fwrite("TADS2 save/g\n\r\x1a",0x10,1,__s);
    if (((sVar4 != 1) || (sVar4 = fwrite(local_88,2,1,__s), sVar4 != 1)) ||
       (sVar3 = fwrite(game_fname,(long)(int)sVar3,1,__s), sVar3 != 1)) goto LAB_00213790;
  }
  sVar3 = fwrite("TADS2 save\n\r\x1a",0xe,1,__s);
  if (((sVar3 == 1) && (sVar3 = fwrite("v2.2.1",7,1,__s), sVar3 == 1)) &&
     (sVar3 = fwrite(local_80->voccxtim,0x1a,1,__s), sVar3 == 1)) {
    pppvVar5 = local_80->voccxinh;
    local_68 = 0;
    iVar6 = 0;
    local_78 = __s;
    local_60 = ctx;
    local_58 = fname;
    do {
      ppvVar9 = *pppvVar5;
      local_6c = iVar6;
      local_50 = pppvVar5;
      if (ppvVar9 != (vocidef **)0x0) {
        lVar10 = 0;
        uVar7 = local_68;
        local_48 = ppvVar9;
        do {
          if ((ppvVar9[lVar10] != (vocidef *)0x0) &&
             ((ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar7 >> 8 & 0xffffff][lVar10] >> 8]
               [(byte)ctx->mcmcxmtb[uVar7 >> 8 & 0xffffff][lVar10]].mcmoflg & 3) != 0)) {
            objnum = (mcmon)uVar7;
            __ptr = mcmlck(ctx,objnum);
            iVar6 = (uint)*(ushort *)(__ptr + 6) * 4;
            if ((__ptr[2] & 2) == 0) {
              iVar6 = 0;
            }
            uVar1 = *(ushort *)(__ptr + 8);
            __size = (ulong)uVar1;
            if (((ppvVar9[lVar10]->vociu).vocius.vociusflg & 0x10) == 0) {
              uVar2 = *(ushort *)(__ptr + 0xc);
              uVar8 = iVar6 + ((uint)uVar1 - (uint)uVar2);
              if (uVar8 == 0) {
LAB_002135f3:
                ctx = local_60;
                mcmunlck(local_60,objnum);
                ppvVar9 = local_48;
                goto LAB_00213609;
              }
              local_88 = (undefined1  [3])((uint3)objnum << 8);
              uStack_83 = (undefined1)uVar8;
              uStack_82 = (undefined1)(uVar8 >> 8);
              local_85 = *(ushort *)(__ptr + 6);
              sVar3 = fwrite(local_88,7,1,local_78);
              if (sVar3 == 1) {
                __ptr = __ptr + uVar2;
                __size = (ulong)uVar8;
                goto LAB_002135df;
              }
            }
            else {
              local_88._1_2_ = objnum;
              local_88[0] = 1;
              local_85 = uVar1;
              sVar3 = fwrite(local_88,7,1,local_78);
              if (sVar3 == 1) {
LAB_002135df:
                sVar3 = fwrite(__ptr,__size,1,local_78);
                if (sVar3 == 1) goto LAB_002135f3;
              }
            }
            mcmunlck(local_60,objnum);
            __s = local_78;
            goto LAB_00213790;
          }
LAB_00213609:
          uVar7 = uVar7 + 1;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x100);
      }
      __s = local_78;
      pppvVar5 = local_50 + 1;
      iVar6 = local_6c + 1;
      local_68 = local_68 + 0x100;
    } while (iVar6 != 0x80);
    local_88 = (undefined1  [3])0xffff00;
    local_85 = 0;
    uStack_83 = 0;
    uStack_82 = 0;
    sVar3 = fwrite(local_88,7,1,local_78);
    f = local_58;
    if ((((sVar3 == 1) &&
         (iVar6 = fiowfda((osfildef *)__s,local_80->voccxdmn,local_80->voccxdmc), iVar6 == 0)) &&
        (iVar6 = fiowfda((osfildef *)__s,local_80->voccxfus,local_80->voccxfuc), iVar6 == 0)) &&
       (iVar6 = fiowfda((osfildef *)__s,local_80->voccxalm,local_80->voccxalc), iVar6 == 0)) {
      local_38 = __s;
      local_40[0] = 0;
      voc_iterate(local_80,0xffff,fiosav_voc_cb,local_40);
      if (local_40[0] == 0) {
        uStack_82 = 0xff;
        uStack_81 = 0xff;
        sVar3 = fwrite(local_88,8,1,__s);
        if (sVar3 == 1) {
          local_88._0_2_ = local_80->voccxme;
          sVar3 = fwrite(local_88,2,1,__s);
          if (sVar3 == 1) {
            fclose(__s);
            os_settype(f,1);
            return 0;
          }
        }
      }
    }
  }
LAB_00213790:
  fclose(__s);
  return 1;
}

Assistant:

int fiosav(voccxdef *vctx, char *fname, char *game_fname)
{
    osfildef   *fp;
    vocidef  ***vpg;
    vocidef   **v;
    int         i;
    int         j;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[8];
    int         err = FALSE;
    struct fiosav_cb_ctx  fnctx;

    /* open the output file */
    if ((fp = osfopwb(fname, OSFTSAVE)) == 0)
        return TRUE;

    /*
     *   If we have game file information, save the game file information
     *   with the saved game file.  This lets the player start the
     *   run-time and restore the game by specifying only the saved game
     *   file.  
     */
    if (game_fname != 0)
    {
        size_t len;
        
        /* write the prefix header */
        len = strlen(game_fname);
        oswp2(buf, len);
        if (osfwb(fp, FIOSAVHDR_PREFIX, (int)sizeof(FIOSAVHDR_PREFIX))
            || osfwb(fp, buf, 2)
            || osfwb(fp, game_fname, (int)len))
            goto ret_error;
    }
    
    /* write save game header and timestamp */
    if (osfwb(fp, FIOSAVHDR, (int)sizeof(FIOSAVHDR))
        || osfwb(fp, FIOSAVVSN, (int)sizeof(FIOSAVVSN))
        || osfwb(fp, vctx->voccxtim, 26))
        goto ret_error;

    /* go through each object, and write if it's been changed */
    for (vpg = vctx->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (*v != 0)
            {
                /* write object if it's dirty */
                if (mcmobjdirty(mctx, (mcmon)obj))
                {
                    p = mcmlck(mctx, (mcmon)obj);
                    mut = p + objrst(p);
                    propcnt = objnprop(p);
                    mutsiz = objfree(p) - objrst(p);
                    if ((objflg(p) & OBJFINDEX) != 0)
                        mutsiz += propcnt * 4;

                    /*
                     *   If the object was dynamically allocated, write
                     *   the whole object.  Otherwise, write just the
                     *   mutable part. 
                     */
                    if ((*v)->vociflg & VOCIFNEW)
                    {
                        /* indicate that the object is dynamic */
                        buf[0] = 1;
                        oswp2(buf + 1, obj);

                        /* write the entire object */
                        mutsiz = objfree(p);
                        oswp2(buf + 3, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, p, mutsiz))
                            err = TRUE;

#ifdef NEVER
                        {
                            int         wrdcnt;
                            
                            /* count the words, and write the count */
                            voc_count(vctx, obj, 0, &wrdcnt, (int *)0);
                            oswp2(buf, wrdcnt);
                            if (osfwb(fp, buf, 2))
                                err = TRUE;
                            
                            /* write the words */
                            fnctx.err = 0;
                            fnctx.fp = fp;
                            voc_iterate(vctx, obj, fiosav_cb, &fnctx);
                            if (fnctx.err != 0)
                                err = TRUE;
                        }
#endif
                    }
                    else if (mutsiz)
                    {
                        /* write number of properties, size of mut, and mut */
                        buf[0] = 0;   /* indicate that the object is static */
                        oswp2(buf + 1, obj);
                        oswp2(buf + 3, propcnt);
                        oswp2(buf + 5, mutsiz);
                        if (osfwb(fp, buf, 7)
                            || osfwb(fp, mut, mutsiz))
                            err = TRUE;
                    }
                    
                    mcmunlck(mctx, (mcmon)obj);
                    if (err != 0)
                        goto ret_error;
                }
            }
        }
    }

    /* write end-of-objects indication */
    buf[0] = 0;
    oswp2(buf + 1, MCMONINV);
    oswp4(buf + 3, 0);
    if (osfwb(fp, buf, 7))
        goto ret_error;

    /* write fuses/daemons/alarms */
    if (fiowfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiowfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiowfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* write run-time vocabulary additions and deletions */
    fnctx.fp = fp;
    fnctx.err = 0;
    voc_iterate(vctx, MCMONINV, fiosav_voc_cb, &fnctx);
    if (fnctx.err)
        goto ret_error;

    /* write end marker for vocabulary additions and deletions */
    oswp2(buf+6, MCMONINV);
    if (osfwb(fp, buf, 8))
        goto ret_error;

    /* write the current "Me" object */
    oswp2(buf, vctx->voccxme);
    if (osfwb(fp, buf, 2))
        goto ret_error;

    /* done - close file and return success indication */
    osfcls(fp);
    os_settype(fname, OSFTSAVE);
    return FALSE;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return TRUE;
}